

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O0

ParquetColumnSchema * __thiscall
duckdb::ParquetReader::ParseSchemaRecursive
          (ParquetReader *this,idx_t depth,idx_t max_define,idx_t max_repeat,idx_t *next_schema_idx,
          idx_t *next_file_idx)

{
  ulong uVar1;
  bool bVar2;
  FileMetaData *next_schema_idx_00;
  unsigned_long uVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  IOException *pIVar6;
  reference pvVar7;
  LogicalType *name_p;
  undefined8 uVar8;
  idx_t in_RCX;
  ParquetReader *in_RDX;
  ParquetColumnSchema *in_RDI;
  idx_t in_R8;
  long *in_R9;
  idx_t *unaff_retaddr;
  value_type *in_stack_00000008;
  LogicalType list_type_1;
  ParquetColumnSchema result_1;
  ParquetColumnSchema list_schema;
  LogicalType list_type;
  ParquetColumnSchema struct_schema_1;
  LogicalType result_type_1;
  ParquetColumnSchema *child_schema_2;
  iterator __end3;
  iterator __begin3;
  vector<duckdb::ParquetColumnSchema,_true> *__range3;
  child_list_t<LogicalType> struct_types;
  ParquetColumnSchema struct_schema;
  LogicalType result_type;
  bool parent_has_children;
  bool parent_is_map;
  value_type *p_ele;
  bool is_map_kv;
  bool is_map;
  bool is_list;
  bool is_repeated;
  string *col_name;
  ParquetColumnSchema *child_schema_1;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::ParquetColumnSchema,_true> *__range2;
  case_insensitive_map_t<idx_t> name_collision_count;
  ParquetColumnSchema child_schema;
  idx_t c_idx;
  vector<duckdb::ParquetColumnSchema,_true> child_schemas;
  ParquetColumnSchema root_schema;
  type repetition_type;
  idx_t this_idx;
  value_type *s_ele;
  FileMetaData *file_meta_data;
  ParquetColumnSchema *result;
  value_type *in_stack_fffffffffffff6d8;
  ParquetColumnSchema *pPVar9;
  vector<duckdb::ParquetColumnSchema,_true> *pvVar10;
  value_type *pvVar11;
  undefined4 in_stack_fffffffffffff6e0;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffff6e4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *in_stack_fffffffffffff6e8;
  GeoParquetFileMetadata *in_stack_fffffffffffff6f0;
  ParquetColumnSchema *in_stack_fffffffffffff700;
  reference in_stack_fffffffffffff708;
  LogicalType *in_stack_fffffffffffff710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff718;
  ParquetColumnSchemaType PVar13;
  LogicalType *in_stack_fffffffffffff720;
  LogicalType *this_00;
  ParquetColumnSchema *in_stack_fffffffffffff728;
  SchemaElement *in_stack_fffffffffffff730;
  ParquetReader *in_stack_fffffffffffff738;
  idx_t in_stack_fffffffffffff740;
  undefined8 in_stack_fffffffffffff748;
  allocator *paVar14;
  idx_t in_stack_fffffffffffff750;
  ParquetColumnSchemaType in_stack_fffffffffffff758;
  bool local_89b;
  bool local_89a;
  bool local_899;
  bool local_88b;
  bool local_88a;
  bool local_889;
  LogicalType local_838 [24];
  string local_820 [39];
  undefined1 local_7f9;
  LogicalType local_7f8 [174];
  undefined1 local_74a;
  allocator local_749;
  string local_748 [32];
  idx_t local_728;
  LogicalType local_720 [24];
  string local_708 [176];
  LogicalType local_658 [24];
  LogicalType local_640 [24];
  string local_628 [176];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578 [24];
  LogicalType local_560 [80];
  reference local_510;
  ParquetColumnSchema *local_508;
  __normal_iterator<duckdb::ParquetColumnSchema_*,_std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>_>
  local_500;
  vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *local_4f8;
  undefined1 local_4d5;
  undefined4 local_4d4;
  LogicalType local_4d0 [24];
  string local_4b8 [39];
  undefined1 local_491;
  LogicalType local_490 [24];
  string local_478 [176];
  LogicalType local_3c8 [24];
  LogicalType local_3b0 [24];
  LogicalType local_398 [30];
  undefined1 local_37a;
  allocator local_379;
  string local_378 [38];
  undefined1 local_352;
  allocator local_351;
  string local_350 [38];
  bool local_32a;
  bool local_329;
  const_reference local_328;
  bool local_31c;
  bool local_31b;
  bool local_31a;
  byte local_319;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_2b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_2b0;
  string *local_2a8;
  reference local_2a0;
  ParquetColumnSchema *local_298;
  __normal_iterator<duckdb::ParquetColumnSchema_*,_std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>_>
  local_290;
  vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *local_288;
  ulong local_1b8;
  vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> local_1b0;
  LogicalType local_188 [316];
  type local_4c;
  long local_48;
  const_reference local_40;
  
  next_schema_idx_00 = GetFileMetadata((ParquetReader *)0x69a127);
  local_40 = vector<duckdb_parquet::SchemaElement,_true>::operator[]
                       ((vector<duckdb_parquet::SchemaElement,_true> *)
                        CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                        (size_type)in_stack_fffffffffffff6d8);
  local_48 = *in_R9;
  local_4c = REQUIRED;
  if ((((ushort)local_40->__isset >> 2 & 1) != 0) && (local_48 != 0)) {
    local_4c = local_40->repetition_type;
  }
  if (local_4c != REQUIRED) {
    in_RCX = in_RCX + 1;
  }
  if (local_4c == REPEATED) {
    in_R8 = in_R8 + 1;
  }
  if (in_RDX == (ParquetReader *)0x1) {
    shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->
              ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)
               CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                        *)0x69a216);
    if (bVar2) {
      shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->
                ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)
                 CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
      unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
      ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                    *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
      bVar2 = GeoParquetFileMetadata::IsGeometryColumn
                        (in_stack_fffffffffffff6f0,&in_stack_fffffffffffff6e8->first);
      if (bVar2) {
        pPVar9 = *(ParquetColumnSchema **)in_stack_00000008;
        *(byte **)in_stack_00000008 = (byte *)((long)&pPVar9->schema_type + 1);
        uVar12 = 0;
        ParseColumnSchema(in_stack_fffffffffffff738,in_stack_fffffffffffff730,
                          (idx_t)in_stack_fffffffffffff728,(idx_t)in_stack_fffffffffffff720,
                          (idx_t)in_stack_fffffffffffff718,in_stack_fffffffffffff750,
                          in_stack_fffffffffffff758);
        PVar13 = (ParquetColumnSchemaType)((ulong)in_stack_fffffffffffff718 >> 0x20);
        ParquetColumnSchema::ParquetColumnSchema
                  ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff6e4,uVar12),pPVar9);
        GeoParquetFileMetadata::GeometryType();
        ParquetColumnSchema::ParquetColumnSchema
                  ((ParquetColumnSchema *)in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                   in_stack_fffffffffffff720,PVar13);
        duckdb::LogicalType::~LogicalType(local_188);
        ParquetColumnSchema::~ParquetColumnSchema
                  ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff6e4,uVar12));
        ParquetColumnSchema::~ParquetColumnSchema
                  ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff6e4,uVar12));
        return in_RDI;
      }
    }
  }
  PVar13 = (ParquetColumnSchemaType)in_stack_fffffffffffff748;
  if ((((ushort)local_40->__isset >> 3 & 1) == 0) || (local_40->num_children < 1)) {
    if (((ushort)local_40->__isset & 1) == 0) {
      local_74a = 1;
      uVar8 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_748,
                 "Node \'%s\' has neither num_children nor type set - this violates the Parquet spec (corrupted file)"
                 ,&local_749);
      std::__cxx11::string::c_str();
      InvalidInputException::InvalidInputException<char_const*>
                ((InvalidInputException *)in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                 (char *)in_stack_fffffffffffff710);
      local_74a = 0;
      __cxa_throw(uVar8,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    pPVar9 = *(ParquetColumnSchema **)in_stack_00000008;
    *(byte **)in_stack_00000008 = (byte *)((long)&pPVar9->schema_type + 1);
    uVar12 = 0;
    ParseColumnSchema(in_stack_fffffffffffff738,in_stack_fffffffffffff730,
                      (idx_t)in_stack_fffffffffffff728,(idx_t)in_stack_fffffffffffff720,
                      (idx_t)in_stack_fffffffffffff718,in_stack_fffffffffffff750,
                      in_stack_fffffffffffff758);
    if (local_40->repetition_type == REPEATED) {
      duckdb::LogicalType::LIST(local_7f8);
      local_7f9 = 0;
      std::__cxx11::string::string(local_820,(string *)&local_40->name);
      duckdb::LogicalType::LogicalType(local_838,local_7f8);
      pvVar11 = *(value_type **)in_stack_00000008;
      uVar12 = 0;
      ParquetColumnSchema::ParquetColumnSchema
                ((ParquetColumnSchema *)in_stack_fffffffffffff730,
                 (string *)in_stack_fffffffffffff728,in_stack_fffffffffffff720,
                 (idx_t)in_stack_fffffffffffff718,(idx_t)in_stack_fffffffffffff710,
                 (idx_t)in_stack_fffffffffffff708,in_stack_fffffffffffff740,PVar13);
      duckdb::LogicalType::~LogicalType(local_838);
      std::__cxx11::string::~string(local_820);
      std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      push_back((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *
                )CONCAT44(in_stack_fffffffffffff6e4,uVar12),pvVar11);
      local_4d4 = 1;
      local_7f9 = 1;
      duckdb::LogicalType::~LogicalType(local_7f8);
    }
    else {
      ParquetColumnSchema::ParquetColumnSchema
                ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff6e4,uVar12),pPVar9);
      local_4d4 = 1;
    }
    ParquetColumnSchema::~ParquetColumnSchema
              ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff6e4,uVar12));
  }
  else {
    vector<duckdb::ParquetColumnSchema,_true>::vector
              ((vector<duckdb::ParquetColumnSchema,_true> *)0x69a3c6);
    local_1b8 = 0;
    while (uVar1 = local_1b8, uVar3 = NumericCast<unsigned_long,int,void>(0), uVar1 < uVar3) {
      *in_R9 = *in_R9 + 1;
      in_stack_fffffffffffff6d8 = in_stack_00000008;
      ParseSchemaRecursive
                (in_RDX,in_RCX,in_R8,(idx_t)in_R9,(idx_t *)next_schema_idx_00,unaff_retaddr);
      std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      push_back((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *
                )CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                in_stack_fffffffffffff6d8);
      local_1b8 = local_1b8 + 1;
      ParquetColumnSchema::~ParquetColumnSchema
                ((ParquetColumnSchema *)
                 CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)0x69a4f7);
    local_288 = &local_1b0;
    local_290._M_current =
         (ParquetColumnSchema *)
         std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
         begin((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *)
               in_stack_fffffffffffff6d8);
    local_298 = (ParquetColumnSchema *)
                std::
                vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
                end((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     *)in_stack_fffffffffffff6d8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::ParquetColumnSchema_*,_std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>_>
                               *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                              (__normal_iterator<duckdb::ParquetColumnSchema_*,_std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>_>
                               *)in_stack_fffffffffffff6d8), bVar2) {
      local_2a0 = __gnu_cxx::
                  __normal_iterator<duckdb::ParquetColumnSchema_*,_std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>_>
                  ::operator*(&local_290);
      local_2a8 = (string *)&local_2a0->name;
      while( true ) {
        local_2b0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)in_stack_fffffffffffff6d8,(key_type *)0x69a58d);
        local_2b8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)in_stack_fffffffffffff6d8);
        bVar2 = std::__detail::operator!=(&local_2b0,&local_2b8);
        if (!bVar2) break;
        pmVar4 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                               *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                              (key_type *)in_stack_fffffffffffff6d8);
        *pmVar4 = *pmVar4 + 1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                     (key_type *)in_stack_fffffffffffff6d8);
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff718);
        std::operator+(in_stack_fffffffffffff718,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff710);
        std::__cxx11::string::operator=(local_2a8,local_2d8);
        std::__cxx11::string::~string(local_2d8);
        std::__cxx11::string::~string(local_318);
        std::__cxx11::string::~string(local_2f8);
      }
      std::__cxx11::string::operator=((string *)&local_2a0->name,local_2a8);
      pmVar4 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                            (key_type *)in_stack_fffffffffffff6d8);
      *pmVar4 = 0;
      __gnu_cxx::
      __normal_iterator<duckdb::ParquetColumnSchema_*,_std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>_>
      ::operator++(&local_290);
    }
    local_319 = local_4c == REPEATED;
    local_889 = false;
    if (((ushort)local_40->__isset >> 4 & 1) != 0) {
      local_889 = local_40->converted_type == LIST;
    }
    local_31a = local_889;
    local_88a = false;
    if (((ushort)local_40->__isset >> 4 & 1) != 0) {
      local_88a = local_40->converted_type == MAP;
    }
    local_31b = local_88a;
    local_88b = false;
    if (((ushort)local_40->__isset >> 4 & 1) != 0) {
      local_88b = local_40->converted_type == MAP_KEY_VALUE;
    }
    local_31c = local_88b;
    if ((local_88b == false) && (local_48 != 0)) {
      local_328 = vector<duckdb_parquet::SchemaElement,_true>::operator[]
                            ((vector<duckdb_parquet::SchemaElement,_true> *)
                             CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                             (size_type)in_stack_fffffffffffff6d8);
      local_899 = false;
      if (((ushort)local_328->__isset >> 4 & 1) != 0) {
        local_899 = local_328->converted_type == MAP;
      }
      local_329 = local_899;
      local_89a = false;
      if (((ushort)local_328->__isset >> 3 & 1) != 0) {
        local_89a = local_328->num_children == 1;
      }
      local_32a = local_89a;
      local_89b = false;
      if (local_899 != false) {
        local_89b = local_89a;
      }
      local_31c = local_89b;
    }
    PVar13 = (ParquetColumnSchemaType)in_stack_fffffffffffff748;
    if (local_31c == false) {
      local_4d5 = 0;
      ParquetColumnSchema::ParquetColumnSchema(in_stack_fffffffffffff700);
      sVar5 = std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
              ::size(&local_1b0);
      PVar13 = (ParquetColumnSchemaType)in_stack_fffffffffffff748;
      if ((sVar5 < 2) &&
         ((((local_31a & 1U) != 0 || ((local_31b & 1U) != 0)) || ((local_319 & 1) != 0)))) {
        in_stack_fffffffffffff708 =
             vector<duckdb::ParquetColumnSchema,_true>::operator[]
                       ((vector<duckdb::ParquetColumnSchema,_true> *)
                        CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                        (size_type)in_stack_fffffffffffff6d8);
        ParquetColumnSchema::operator=
                  ((ParquetColumnSchema *)
                   CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                   in_stack_fffffffffffff6d8);
        std::__cxx11::string::operator=((string *)&in_RDI->name,(string *)&local_40->name);
      }
      else {
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  *)0x69af8d);
        local_4f8 = &local_1b0;
        local_500._M_current =
             (ParquetColumnSchema *)
             std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ::begin((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                      *)in_stack_fffffffffffff6d8);
        local_508 = (ParquetColumnSchema *)
                    std::
                    vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                    ::end((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                           *)in_stack_fffffffffffff6d8);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<duckdb::ParquetColumnSchema_*,_std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>_>
                              *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                             (__normal_iterator<duckdb::ParquetColumnSchema_*,_std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>_>
                              *)in_stack_fffffffffffff6d8);
          PVar13 = (ParquetColumnSchemaType)in_stack_fffffffffffff748;
          if (!bVar2) break;
          local_510 = __gnu_cxx::
                      __normal_iterator<duckdb::ParquetColumnSchema_*,_std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>_>
                      ::operator*(&local_500);
          std::make_pair<std::__cxx11::string&,duckdb::LogicalType&>
                    (&in_stack_fffffffffffff6e8->first,
                     (LogicalType *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
          std::
          vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
          ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                    ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                      *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                   *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
          __gnu_cxx::
          __normal_iterator<duckdb::ParquetColumnSchema_*,_std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>_>
          ::operator++(&local_500);
        }
        in_stack_fffffffffffff718 = local_578;
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  *)in_stack_fffffffffffff6d8);
        duckdb::LogicalType::STRUCT(local_560,in_stack_fffffffffffff718);
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                   *)0x69b0cc);
        std::__cxx11::string::string(local_628,(string *)&local_40->name);
        in_stack_fffffffffffff710 = local_640;
        duckdb::LogicalType::LogicalType(in_stack_fffffffffffff710,local_560);
        pPVar9 = *(ParquetColumnSchema **)in_stack_00000008;
        uVar12 = 0;
        ParquetColumnSchema::ParquetColumnSchema
                  ((ParquetColumnSchema *)in_stack_fffffffffffff730,
                   (string *)in_stack_fffffffffffff728,in_stack_fffffffffffff720,
                   (idx_t)in_stack_fffffffffffff718,(idx_t)in_stack_fffffffffffff710,
                   (idx_t)in_stack_fffffffffffff708,in_stack_fffffffffffff740,PVar13);
        duckdb::LogicalType::~LogicalType(local_640);
        std::__cxx11::string::~string(local_628);
        vector<duckdb::ParquetColumnSchema,_true>::operator=
                  ((vector<duckdb::ParquetColumnSchema,_true> *)
                   CONCAT44(in_stack_fffffffffffff6e4,uVar12),
                   (vector<duckdb::ParquetColumnSchema,_true> *)pPVar9);
        ParquetColumnSchema::operator=
                  ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff6e4,uVar12),pPVar9);
        ParquetColumnSchema::~ParquetColumnSchema
                  ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff6e4,uVar12));
        duckdb::LogicalType::~LogicalType(local_560);
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                   *)0x69b1bc);
      }
      if ((local_319 & 1) != 0) {
        duckdb::LogicalType::LIST(local_658);
        std::__cxx11::string::string(local_708,(string *)&local_40->name);
        duckdb::LogicalType::LogicalType(local_720,local_658);
        pvVar11 = *(value_type **)in_stack_00000008;
        uVar12 = 0;
        ParquetColumnSchema::ParquetColumnSchema
                  ((ParquetColumnSchema *)in_stack_fffffffffffff730,
                   (string *)in_stack_fffffffffffff728,in_stack_fffffffffffff720,
                   (idx_t)in_stack_fffffffffffff718,(idx_t)in_stack_fffffffffffff710,
                   (idx_t)in_stack_fffffffffffff708,in_stack_fffffffffffff740,PVar13);
        duckdb::LogicalType::~LogicalType(local_720);
        std::__cxx11::string::~string(local_708);
        std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        push_back((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                   *)CONCAT44(in_stack_fffffffffffff6e4,uVar12),pvVar11);
        ParquetColumnSchema::operator=
                  ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff6e4,uVar12),pvVar11);
        ParquetColumnSchema::~ParquetColumnSchema
                  ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff6e4,uVar12));
        duckdb::LogicalType::~LogicalType(local_658);
      }
      optional_idx::optional_idx
                ((optional_idx *)in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718);
      (in_RDI->parent_schema_index).index = local_728;
      local_4d4 = 1;
      local_4d5 = 1;
    }
    else {
      sVar5 = std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
              ::size(&local_1b0);
      if (sVar5 != 2) {
        local_352 = 1;
        pIVar6 = (IOException *)__cxa_allocate_exception(0x10);
        paVar14 = &local_351;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_350,"MAP_KEY_VALUE requires two children",paVar14);
        duckdb::IOException::IOException(pIVar6,local_350);
        local_352 = 0;
        __cxa_throw(pIVar6,&IOException::typeinfo,IOException::~IOException);
      }
      if ((local_319 & 1) == 0) {
        local_37a = 1;
        pIVar6 = (IOException *)__cxa_allocate_exception(0x10);
        paVar14 = &local_379;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_378,"MAP_KEY_VALUE needs to be repeated",paVar14);
        duckdb::IOException::IOException(pIVar6,local_378);
        local_37a = 0;
        __cxa_throw(pIVar6,&IOException::typeinfo,IOException::~IOException);
      }
      pvVar7 = vector<duckdb::ParquetColumnSchema,_true>::operator[]
                         ((vector<duckdb::ParquetColumnSchema,_true> *)
                          CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                          (size_type)in_stack_fffffffffffff6d8);
      duckdb::LogicalType::LogicalType(local_3b0,&pvVar7->type);
      pvVar7 = vector<duckdb::ParquetColumnSchema,_true>::operator[]
                         ((vector<duckdb::ParquetColumnSchema,_true> *)
                          CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                          (size_type)in_stack_fffffffffffff6d8);
      duckdb::LogicalType::LogicalType(local_3c8,&pvVar7->type);
      duckdb::LogicalType::MAP(local_398,local_3b0,local_3c8);
      duckdb::LogicalType::~LogicalType(local_3c8);
      duckdb::LogicalType::~LogicalType(local_3b0);
      std::__cxx11::string::string(local_478,(string *)&local_40->name);
      name_p = (LogicalType *)duckdb::ListType::GetChildType(local_398);
      duckdb::LogicalType::LogicalType(local_490,name_p);
      pvVar10 = *(vector<duckdb::ParquetColumnSchema,_true> **)in_stack_00000008;
      uVar12 = 0;
      ParquetColumnSchema::ParquetColumnSchema
                (pvVar7,(string *)name_p,in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                 (idx_t)in_stack_fffffffffffff710,(idx_t)in_stack_fffffffffffff708,
                 in_stack_fffffffffffff740,PVar13);
      duckdb::LogicalType::~LogicalType(local_490);
      std::__cxx11::string::~string(local_478);
      vector<duckdb::ParquetColumnSchema,_true>::operator=
                ((vector<duckdb::ParquetColumnSchema,_true> *)
                 CONCAT44(in_stack_fffffffffffff6e4,uVar12),pvVar10);
      local_491 = 0;
      std::__cxx11::string::string(local_4b8,(string *)&local_40->name);
      this_00 = local_4d0;
      duckdb::LogicalType::LogicalType(this_00,local_398);
      pvVar11 = *(value_type **)in_stack_00000008;
      uVar12 = 0;
      ParquetColumnSchema::ParquetColumnSchema
                (pvVar7,(string *)name_p,this_00,(idx_t)in_stack_fffffffffffff718,
                 (idx_t)in_stack_fffffffffffff710,(idx_t)in_stack_fffffffffffff708,
                 in_stack_fffffffffffff740,PVar13);
      duckdb::LogicalType::~LogicalType(local_4d0);
      std::__cxx11::string::~string(local_4b8);
      std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      push_back((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *
                )CONCAT44(in_stack_fffffffffffff6e4,uVar12),pvVar11);
      local_491 = 1;
      local_4d4 = 1;
      ParquetColumnSchema::~ParquetColumnSchema
                ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff6e4,uVar12));
      duckdb::LogicalType::~LogicalType(local_398);
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)0x69b4a0);
    vector<duckdb::ParquetColumnSchema,_true>::~vector
              ((vector<duckdb::ParquetColumnSchema,_true> *)0x69b4ad);
  }
  return in_RDI;
}

Assistant:

ParquetColumnSchema ParquetReader::ParseSchemaRecursive(idx_t depth, idx_t max_define, idx_t max_repeat,
                                                        idx_t &next_schema_idx, idx_t &next_file_idx) {

	auto file_meta_data = GetFileMetadata();
	D_ASSERT(file_meta_data);
	D_ASSERT(next_schema_idx < file_meta_data->schema.size());
	auto &s_ele = file_meta_data->schema[next_schema_idx];
	auto this_idx = next_schema_idx;

	auto repetition_type = FieldRepetitionType::REQUIRED;
	if (s_ele.__isset.repetition_type && this_idx > 0) {
		repetition_type = s_ele.repetition_type;
	}
	if (repetition_type != FieldRepetitionType::REQUIRED) {
		max_define++;
	}
	if (repetition_type == FieldRepetitionType::REPEATED) {
		max_repeat++;
	}

	// Check for geoparquet spatial types
	if (depth == 1) {
		// geoparquet types have to be at the root of the schema, and have to be present in the kv metadata
		if (metadata->geo_metadata && metadata->geo_metadata->IsGeometryColumn(s_ele.name)) {
			auto root_schema = ParseColumnSchema(s_ele, max_define, max_repeat, this_idx, next_file_idx++);
			return ParquetColumnSchema(std::move(root_schema), GeoParquetFileMetadata::GeometryType(),
			                           ParquetColumnSchemaType::GEOMETRY);
		}
	}

	if (s_ele.__isset.num_children && s_ele.num_children > 0) { // inner node
		vector<ParquetColumnSchema> child_schemas;

		idx_t c_idx = 0;
		while (c_idx < NumericCast<idx_t>(s_ele.num_children)) {
			next_schema_idx++;

			auto child_schema = ParseSchemaRecursive(depth + 1, max_define, max_repeat, next_schema_idx, next_file_idx);
			child_schemas.push_back(std::move(child_schema));
			c_idx++;
		}
		// rename child type entries if there are case-insensitive duplicates by appending _1, _2 etc.
		// behavior consistent with CSV reader fwiw
		case_insensitive_map_t<idx_t> name_collision_count;
		for (auto &child_schema : child_schemas) {
			auto &col_name = child_schema.name;
			// avoid duplicate header names
			while (name_collision_count.find(col_name) != name_collision_count.end()) {
				name_collision_count[col_name] += 1;
				col_name = col_name + "_" + to_string(name_collision_count[col_name]);
			}
			child_schema.name = col_name;
			name_collision_count[col_name] = 0;
		}

		bool is_repeated = repetition_type == FieldRepetitionType::REPEATED;
		bool is_list = s_ele.__isset.converted_type && s_ele.converted_type == ConvertedType::LIST;
		bool is_map = s_ele.__isset.converted_type && s_ele.converted_type == ConvertedType::MAP;
		bool is_map_kv = s_ele.__isset.converted_type && s_ele.converted_type == ConvertedType::MAP_KEY_VALUE;
		if (!is_map_kv && this_idx > 0) {
			// check if the parent node of this is a map
			auto &p_ele = file_meta_data->schema[this_idx - 1];
			bool parent_is_map = p_ele.__isset.converted_type && p_ele.converted_type == ConvertedType::MAP;
			bool parent_has_children = p_ele.__isset.num_children && p_ele.num_children == 1;
			is_map_kv = parent_is_map && parent_has_children;
		}

		if (is_map_kv) {
			if (child_schemas.size() != 2) {
				throw IOException("MAP_KEY_VALUE requires two children");
			}
			if (!is_repeated) {
				throw IOException("MAP_KEY_VALUE needs to be repeated");
			}
			auto result_type = LogicalType::MAP(child_schemas[0].type, child_schemas[1].type);
			ParquetColumnSchema struct_schema(s_ele.name, ListType::GetChildType(result_type), max_define - 1,
			                                  max_repeat - 1, this_idx, next_file_idx);
			struct_schema.children = std::move(child_schemas);

			ParquetColumnSchema map_schema(s_ele.name, std::move(result_type), max_define, max_repeat, this_idx,
			                               next_file_idx);
			map_schema.children.push_back(std::move(struct_schema));
			return map_schema;
		}
		ParquetColumnSchema result;
		if (child_schemas.size() > 1 || (!is_list && !is_map && !is_repeated)) {
			child_list_t<LogicalType> struct_types;
			for (auto &child_schema : child_schemas) {
				struct_types.emplace_back(make_pair(child_schema.name, child_schema.type));
			}

			auto result_type = LogicalType::STRUCT(std::move(struct_types));
			ParquetColumnSchema struct_schema(s_ele.name, std::move(result_type), max_define, max_repeat, this_idx,
			                                  next_file_idx);
			struct_schema.children = std::move(child_schemas);
			result = std::move(struct_schema);
		} else {
			// if we have a struct with only a single type, pull up
			result = std::move(child_schemas[0]);
			result.name = s_ele.name;
		}
		if (is_repeated) {
			auto list_type = LogicalType::LIST(result.type);
			ParquetColumnSchema list_schema(s_ele.name, std::move(list_type), max_define, max_repeat, this_idx,
			                                next_file_idx);
			list_schema.children.push_back(std::move(result));
			result = std::move(list_schema);
		}
		result.parent_schema_index = this_idx;
		return result;
	} else { // leaf node
		if (!s_ele.__isset.type) {
			throw InvalidInputException(
			    "Node '%s' has neither num_children nor type set - this violates the Parquet spec (corrupted file)",
			    s_ele.name.c_str());
		}
		auto result = ParseColumnSchema(s_ele, max_define, max_repeat, this_idx, next_file_idx++);
		if (s_ele.repetition_type == FieldRepetitionType::REPEATED) {
			auto list_type = LogicalType::LIST(result.type);
			ParquetColumnSchema list_schema(s_ele.name, std::move(list_type), max_define, max_repeat, this_idx,
			                                next_file_idx);
			list_schema.children.push_back(std::move(result));
			return list_schema;
		}
		return result;
	}
}